

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserexternalvariable.cpp
# Opt level: O2

void __thiscall
AnalyserExternalVariable_containsDependencyByName_Test::TestBody
          (AnalyserExternalVariable_containsDependencyByName_Test *this)

{
  element_type *peVar1;
  bool bVar2;
  byte bVar3;
  char *pcVar4;
  allocator<char> local_a2;
  allocator<char> local_a1;
  string local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  unsigned_long local_90 [4];
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  AnalyserExternalVariablePtr externalVariable;
  ModelPtr model;
  ParserPtr parser;
  
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml",
             (allocator<char> *)&externalVariable);
  fileContents((string *)&gtest_ar);
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_90);
  local_90[0] = 0;
  externalVariable.
  super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(0)","parser->issueCount()",local_90,
             (unsigned_long *)&externalVariable);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_90);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&externalVariable,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
               ,0xa9,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&externalVariable,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&externalVariable);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar2 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"membrane",&local_a2);
  libcellml::ComponentEntity::component(local_a0,bVar2);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"V",&local_a1);
  libcellml::Component::variable((string *)&gtest_ar_);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&externalVariable);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
  std::__cxx11::string::~string((string *)&gtest_ar);
  peVar1 = externalVariable.
           super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"membrane",&local_a2);
  libcellml::ComponentEntity::component
            (local_a0,(bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr._0_1_);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"Cm",&local_a1);
  libcellml::Component::variable((string *)&gtest_ar_);
  libcellml::AnalyserExternalVariable::addDependency((shared_ptr *)peVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
  std::__cxx11::string::~string((string *)&gtest_ar);
  peVar1 = externalVariable.
           super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"membrane",(allocator<char> *)local_a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"Cm",&local_a2);
  gtest_ar_.success_ =
       (bool)libcellml::AnalyserExternalVariable::containsDependency
                       ((shared_ptr *)peVar1,(string *)&model,(string *)&gtest_ar);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,
               "externalVariable->containsDependency(model, \"membrane\", \"Cm\")","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
               ,0xaf,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  peVar1 = externalVariable.
           super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"membrane",(allocator<char> *)local_a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"X",&local_a2);
  bVar3 = libcellml::AnalyserExternalVariable::containsDependency
                    ((shared_ptr *)peVar1,(string *)&model,(string *)&gtest_ar);
  gtest_ar_.success_ = (bool)(bVar3 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (bVar3 != 0) {
    testing::Message::Message((Message *)local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,
               "externalVariable->containsDependency(model, \"membrane\", \"X\")","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
               ,0xb0,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&externalVariable.
              super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(AnalyserExternalVariable, containsDependencyByName)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto externalVariable = libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V"));

    externalVariable->addDependency(model->component("membrane")->variable("Cm"));

    EXPECT_TRUE(externalVariable->containsDependency(model, "membrane", "Cm"));
    EXPECT_FALSE(externalVariable->containsDependency(model, "membrane", "X"));
}